

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

uint crnlib::rg_etc1::pack_etc1_block
               (void *pETC1_block,uint *pSrc_pixels_rgba,etc1_pack_params *pack_params)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  int *piVar8;
  bool bVar9;
  uint uVar10;
  int *piVar11;
  byte bVar12;
  undefined2 uVar13;
  uint uVar14;
  uint *puVar15;
  undefined1 *puVar16;
  undefined2 uVar17;
  uint uVar18;
  undefined2 *puVar19;
  short *psVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  byte bVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  byte *pbVar29;
  int iVar30;
  int *piVar31;
  long lVar32;
  ulong uVar33;
  ushort *puVar34;
  ushort *puVar35;
  int iVar36;
  int iVar37;
  ulong *puVar38;
  uint i;
  bool bVar39;
  color_quad_u8 subblock_pixels [8];
  results results [3];
  etc1_optimizer optimizer;
  uint8 best_selectors [2] [8];
  uint8 selectors [3] [8];
  color_quad_u8 dithered_pixels [16];
  undefined1 local_3aa;
  byte local_3a9;
  ulong local_398;
  ulong local_390;
  undefined4 local_384;
  int local_380;
  int local_37c;
  uint local_378;
  uint local_374;
  ulong local_360;
  uint local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  ulong local_310;
  undefined4 local_304;
  undefined8 local_300;
  ulong local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  long local_2e0 [2];
  undefined4 local_2d0;
  int local_2cc;
  void *local_2c0;
  byte local_2b8;
  undefined8 local_2b0;
  undefined4 local_2a8;
  undefined4 local_2a4;
  void *local_298;
  undefined1 local_290 [8];
  ulong local_288;
  uint local_280 [4];
  void *local_270;
  byte local_268 [8];
  undefined8 local_260;
  uint local_258;
  undefined4 local_254;
  uint local_250;
  void *local_248;
  undefined1 local_240;
  ulong local_238;
  uint local_230;
  uint local_22c;
  uint local_228;
  long *local_220;
  byte local_218;
  void *local_208;
  void *local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  etc1_pack_params local_1e0;
  undefined4 local_1d8;
  undefined8 *local_1d0;
  undefined1 local_1c8;
  int *local_1c0;
  undefined4 local_1b8;
  uint uStack_1b4;
  undefined1 local_1b0;
  undefined1 local_1a8 [128];
  undefined1 local_128 [16];
  etc1_solution_coordinates local_108 [2];
  uint64 local_f0;
  bool local_e8;
  etc1_solution_coordinates local_e0 [2];
  uint64 local_c8;
  bool local_c0;
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  uint local_78 [18];
  
  uVar14 = 0x10;
  do {
    uVar23 = uVar14 - 1;
    if (pSrc_pixels_rgba[uVar23] != *pSrc_pixels_rgba) goto LAB_0018d377;
    uVar14 = uVar14 - 1;
  } while (1 < uVar14);
  uVar23 = 0;
LAB_0018d377:
  if (uVar23 == 0) {
    uVar14 = 0xffffffff;
    uVar23 = 0;
    uVar18 = 0;
    uVar22 = 0;
    local_398 = 0;
    uVar33 = 0;
    do {
      if (uVar33 == 3) break;
      bVar39 = false;
      iVar36 = -1;
      do {
        iVar37 = iVar36 + (uint)*(byte *)((long)pSrc_pixels_rgba + uVar33);
        if (0xfe < iVar37) {
          iVar37 = 0xff;
        }
        if (iVar37 < 1) {
          iVar37 = 0;
        }
        puVar34 = &g_color8_to_etc_block_config_0_255;
        if (iVar37 != 0) {
          if (iVar37 == 0xff) {
            puVar34 = &DAT_001a5a52;
          }
          else {
            puVar34 = (ushort *)(g_color8_to_etc_block_config_1_to_254 + (long)(iVar37 + -1) * 0x18)
            ;
          }
        }
        local_340 = (uint)*(byte *)((long)pSrc_pixels_rgba + uVar33);
        do {
          puVar35 = puVar34 + 1;
          uVar27 = (uint)*puVar34;
          uVar10 = (uVar27 & 0xff) << 9;
          uVar2 = *(ushort *)
                   (g_etc1_inverse_lookup +
                   (ulong)*(byte *)((long)pSrc_pixels_rgba +
                                   (ulong)(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                                  ::s_next_comp)[uVar33]) * 2 + (ulong)uVar10);
          uVar3 = *(ushort *)
                   (g_etc1_inverse_lookup +
                   (ulong)*(byte *)((long)pSrc_pixels_rgba + (ulong)(uint)(&DAT_001a5474)[uVar33]) *
                   2 + (ulong)uVar10);
          uVar26 = (uint)(uVar2 >> 8);
          uVar10 = (uint)(uVar3 >> 8);
          uVar10 = uVar10 * uVar10 + uVar26 * uVar26 + (iVar37 - local_340) * (iVar37 - local_340);
          iVar30 = 0;
          bVar9 = true;
          if (uVar10 < uVar14) {
            uVar18 = uVar2 & 0xff;
            uVar23 = uVar3 & 0xff;
            if (uVar10 == 0) {
              bVar9 = false;
              iVar30 = 10;
              uVar22 = (ulong)uVar27;
              local_398 = uVar33 & 0xffffffff;
              uVar14 = 0;
            }
            else {
              iVar30 = 0;
              uVar22 = (ulong)uVar27;
              local_398 = uVar33 & 0xffffffff;
              uVar14 = uVar10;
            }
          }
          if (!bVar9) goto LAB_0018dfdc;
          puVar34 = puVar35;
        } while (*puVar35 != 0xffff);
        iVar30 = 0;
LAB_0018dfdc:
        if (iVar30 != 0) break;
        iVar37 = iVar36 + 1;
        bVar39 = 0 < iVar36;
        iVar36 = iVar37;
      } while (iVar37 != 2);
      uVar33 = uVar33 + 1;
    } while (bVar39);
    *(byte *)((long)pETC1_block + 3) =
         ((byte)uVar22 * '\x02' & 0x1c) * '\t' + ((byte)uVar22 & 1) * '\x02';
    bVar12 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)((uint)(uVar22 >> 4) & 3));
    *(short *)((long)pETC1_block + 4) = (short)((int)((uint)bVar12 << 0x1e) >> 0x1f);
    *(ushort *)((long)pETC1_block + 6) = -(bVar12 & 1);
    uVar10 = (uint)uVar22 >> 8;
    if ((uVar22 & 1) == 0) {
      *(byte *)((long)pETC1_block + local_398) = (byte)(uVar10 << 4) | (byte)(uVar22 >> 8);
      *(byte *)((long)pETC1_block +
               (ulong)(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp)[local_398]) = (byte)(uVar18 << 4) | (byte)uVar18;
      bVar12 = (byte)(uVar23 << 4) | (byte)uVar23;
    }
    else {
      *(char *)((long)pETC1_block + local_398) = (char)(uVar10 << 3);
      *(byte *)((long)pETC1_block +
               (ulong)(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp)[local_398]) = (byte)uVar18 << 3;
      bVar12 = (byte)uVar23 << 3;
    }
    *(byte *)((long)pETC1_block +
             (ulong)(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                            ::s_next_comp)[(int)local_398 + 1]) = bVar12;
    uVar14 = uVar14 << 4;
  }
  else {
    if (pack_params->m_dithering == true) {
      piVar11 = (int *)(local_1a8 + 0x10);
      puVar15 = local_78;
      local_78[0] = 0xffffffff;
      local_78[1] = 0xffffffff;
      local_78[2] = 0xffffffff;
      local_78[3] = 0xffffffff;
      local_78[4] = 0xffffffff;
      local_78[5] = 0xffffffff;
      local_78[6] = 0xffffffff;
      local_78[7] = 0xffffffff;
      local_78[8] = 0xffffffff;
      local_78[9] = 0xffffffff;
      local_78[10] = 0xffffffff;
      local_78[0xb] = 0xffffffff;
      local_78[0xc] = 0xffffffff;
      local_78[0xd] = 0xffffffff;
      local_78[0xe] = 0xffffffff;
      local_78[0xf] = 0xffffffff;
      piVar31 = (int *)local_1a8;
      lVar24 = 0;
      do {
        local_1a8._16_16_ = (undefined1  [16])0x0;
        local_1a8._0_16_ = (undefined1  [16])0x0;
        lVar32 = 0;
        piVar8 = piVar11;
        do {
          piVar11 = piVar31;
          piVar31 = piVar8;
          bVar12 = *(byte *)((long)pSrc_pixels_rgba + lVar32);
          bVar25 = (&DAT_001d6b48)[(long)(*piVar31 * 5 + piVar31[1] * 3 >> 4) + (ulong)bVar12];
          *(byte *)((long)puVar15 + lVar32) = bVar25;
          iVar36 = (uint)bVar12 - (uint)bVar25;
          *piVar11 = iVar36;
          bVar12 = *(byte *)((long)pSrc_pixels_rgba + lVar32 + 4);
          bVar25 = (&DAT_001d6b48)
                   [(long)(piVar31[1] * 5 + piVar31[2] * 3 + iVar36 * 7 + *piVar31 >> 4) +
                    (ulong)bVar12];
          *(byte *)((long)puVar15 + lVar32 + 4) = bVar25;
          iVar36 = (uint)bVar12 - (uint)bVar25;
          piVar11[1] = iVar36;
          bVar12 = *(byte *)((long)pSrc_pixels_rgba + lVar32 + 8);
          bVar25 = (&DAT_001d6b48)
                   [(long)(piVar31[2] * 5 + piVar31[3] * 3 + iVar36 * 7 + piVar31[1] >> 4) +
                    (ulong)bVar12];
          *(byte *)((long)puVar15 + lVar32 + 8) = bVar25;
          iVar36 = (uint)bVar12 - (uint)bVar25;
          piVar11[2] = iVar36;
          bVar12 = *(byte *)((long)pSrc_pixels_rgba + lVar32 + 0xc);
          bVar25 = (&DAT_001d6b48)
                   [(long)(piVar31[3] * 5 + iVar36 * 7 + piVar31[2] >> 4) + (ulong)bVar12];
          *(byte *)((long)puVar15 + lVar32 + 0xc) = bVar25;
          piVar11[3] = (uint)bVar12 - (uint)bVar25;
          lVar32 = lVar32 + 0x10;
          piVar8 = piVar11;
        } while ((int)lVar32 != 0x40);
        lVar24 = lVar24 + 1;
        puVar15 = (uint *)((long)puVar15 + 1);
        pSrc_pixels_rgba = (uint *)((long)pSrc_pixels_rgba + 1);
      } while (lVar24 != 3);
      pSrc_pixels_rgba = local_78;
    }
    local_108[0].m_color4 = false;
    local_108[0].m_unscaled_color.field_0 = (anon_union_4_3_dd316fa8_for_color_quad_u8_0)0x0;
    local_108[0].m_inten_table = 0;
    local_f0 = 0xffffffffffffffff;
    local_e8 = false;
    local_e0[0].m_unscaled_color.field_0 = (anon_union_4_3_dd316fa8_for_color_quad_u8_0)0x0;
    local_e0[0].m_inten_table = 0;
    local_e0[0].m_color4 = false;
    local_c8 = 0xffffffffffffffff;
    local_c0 = false;
    local_1a8._0_16_ = (undefined1  [16])0x0;
    local_128 = (undefined1  [16])0x0;
    lVar24 = 3;
    puVar16 = local_a8;
    do {
      *(undefined4 *)(local_2e0 + lVar24) = 8;
      local_2e0[lVar24 + 1] = (long)puVar16;
      lVar24 = lVar24 + 5;
      puVar16 = puVar16 + 8;
    } while (lVar24 == 8);
    lVar24 = 3;
    puVar16 = local_98;
    do {
      *(undefined4 *)(local_290 + lVar24 * 8) = 8;
      (&local_288)[lVar24] = (ulong)puVar16;
      lVar24 = lVar24 + 5;
      puVar16 = puVar16 + 8;
    } while (lVar24 != 0x12);
    local_1e0 = *pack_params;
    local_1c8 = 0;
    local_1c0 = (int *)&etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
    local_1b8 = 1;
    uStack_1b4 = 0;
    local_1b0 = 0;
    local_1d8 = 8;
    local_1d0 = &local_338;
    local_200 = local_2c0;
    local_208 = local_298;
    local_378 = local_2d0;
    local_3a9 = local_2b8;
    local_380 = local_2cc;
    local_2f0 = (ulong)local_2a8;
    local_3aa = local_290[0];
    local_384 = local_2a4;
    local_300 = local_2b0;
    local_360 = 0xffffffffffffffff;
    local_2f8 = local_2e0[1];
    local_37c = 0;
    local_2e8 = 0;
    iVar36 = 0;
    do {
      uVar14 = 0;
      do {
        bVar39 = true;
        lVar24 = 0;
        local_310 = 0;
        do {
          if (iVar36 == 0) {
            local_338 = CONCAT44(pSrc_pixels_rgba[lVar24 * 2 + 4],pSrc_pixels_rgba[lVar24 * 2]);
            uStack_330 = CONCAT44(pSrc_pixels_rgba[lVar24 * 2 + 0xc],
                                  pSrc_pixels_rgba[lVar24 * 2 + 8]);
            local_328 = CONCAT44(pSrc_pixels_rgba[lVar24 * 2 + 5],pSrc_pixels_rgba[lVar24 * 2 + 1]);
            uStack_320 = CONCAT44(pSrc_pixels_rgba[lVar24 * 2 + 0xd],
                                  pSrc_pixels_rgba[lVar24 * 2 + 9]);
          }
          else {
            local_328 = *(undefined8 *)(pSrc_pixels_rgba + lVar24 * 8 + 4);
            uStack_320 = *(undefined8 *)(pSrc_pixels_rgba + lVar24 * 8 + 4 + 2);
            local_338 = *(undefined8 *)(pSrc_pixels_rgba + lVar24 * 8);
            uStack_330 = *(undefined8 *)(pSrc_pixels_rgba + lVar24 * 8 + 2);
          }
          local_238 = 0xffffffffffffffff;
          local_2e0[0] = lVar24;
          if ((uVar14 != 0 || (int)lVar24 != 0) && 0 < (int)local_1e0.m_quality) {
            uVar23 = 8;
            do {
              uVar18 = uVar23 - 1;
              if (*(int *)((long)&local_338 + (ulong)uVar18 * 4) != (int)local_338)
              goto LAB_0018d7a1;
              uVar23 = uVar23 - 1;
            } while (1 < uVar23);
            uVar18 = 0;
LAB_0018d7a1:
            if (uVar18 == 0) {
              puVar15 = (uint *)0x0;
              if (lVar24 != 0 && uVar14 == 0) {
                puVar15 = local_280;
              }
              uVar10 = 0xffffffff;
              uVar23 = 0;
              uVar18 = 0;
              local_374 = 0;
              local_390 = 0;
              uVar33 = 0;
              do {
                uVar6 = (undefined1)uVar23;
                uVar7 = (undefined1)uVar18;
                if (uVar33 == 3) break;
                local_1f8 = uVar33 + 1;
                uVar28 = 0xffffffff;
                uVar21 = 0;
                local_1f0 = (ulong)*(byte *)((long)&local_338 + uVar33);
                uVar22 = (ulong)*(byte *)((long)&local_338 + uVar33);
                do {
                  local_304 = (int)uVar21;
                  iVar37 = (int)uVar28;
                  iVar30 = iVar37 + (int)uVar22;
                  if (0xfe < iVar30) {
                    iVar30 = 0xff;
                  }
                  if (iVar30 < 1) {
                    iVar30 = 0;
                  }
                  puVar19 = &g_color8_to_etc_block_config_0_255;
                  if (iVar30 != 0) {
                    if (iVar30 == 0xff) {
                      puVar19 = &DAT_001a5a52;
                    }
                    else {
                      puVar19 = (undefined2 *)
                                (g_color8_to_etc_block_config_1_to_254 + (long)(iVar30 + -1) * 0x18)
                      ;
                    }
                  }
                  local_1e8 = uVar28;
                  iVar30 = iVar30 - (int)uVar22;
                  psVar20 = puVar19 + 1;
                  do {
                    uVar2 = psVar20[-1];
                    bVar12 = (byte)uVar2;
                    if ((uVar14 == 0) == (bool)(bVar12 & 1)) {
                      bVar25 = (lVar24 != 0 && uVar14 == 0) & bVar12;
                      if ((bVar25 == 1) &&
                         (7 < ((uint)(uVar2 >> 8) - (uint)*(byte *)((long)puVar15 + uVar33)) + 4)) {
                        bVar12 = *psVar20 == -1 ^ 9;
                      }
                      else {
                        uVar3 = *(ushort *)
                                 (g_etc1_inverse_lookup +
                                 (ulong)*(byte *)((long)&local_338 +
                                                 (ulong)(uint)(&
                                                  pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                                  ::s_next_comp)[uVar33]) * 2 +
                                 (ulong)bVar12 * 0x200);
                        uVar4 = *(ushort *)
                                 (g_etc1_inverse_lookup +
                                 (ulong)*(byte *)((long)&local_338 +
                                                 (ulong)(uint)(&DAT_001a5474)[uVar33]) * 2 +
                                 (ulong)bVar12 * 0x200);
                        if ((bVar25 == 0) ||
                           (((uVar4 & 0xff) -
                            (uint)*(byte *)((long)puVar15 + (ulong)(uint)(&DAT_001a5474)[uVar33])) +
                            4 < 8 && ((uVar3 & 0xff) -
                                     (uint)*(byte *)((long)puVar15 +
                                                    (ulong)(uint)(&
                                                  pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                                  ::s_next_comp)[uVar33])) + 4 < 8)) {
                          uVar26 = (uint)(uVar4 >> 8) * (uint)(uVar4 >> 8) +
                                   (uint)(uVar3 >> 8) * (uint)(uVar3 >> 8) + iVar30 * iVar30;
                          bVar12 = 0;
                          if (uVar26 < uVar10) {
                            bVar12 = 0;
                            if (uVar26 == 0) {
                              bVar12 = 10;
                            }
                            local_374 = (uint)uVar2;
                            local_390 = uVar33 & 0xffffffff;
                            uVar10 = uVar26;
                            uVar23 = (uint)uVar4;
                            uVar18 = (uint)uVar3;
                          }
                        }
                        else {
                          bVar12 = *psVar20 == -1 ^ 9;
                        }
                      }
                    }
                    else {
                      bVar12 = *psVar20 == -1 ^ 9;
                    }
                    uVar6 = (undefined1)uVar23;
                    uVar7 = (undefined1)uVar18;
                    if ((bVar12 != 0) && (bVar12 != 9)) {
                      if (bVar12 != 8) {
                        uVar21 = uVar21 & 0xffffffff;
                        goto LAB_0018da54;
                      }
                      break;
                    }
                    sVar5 = *psVar20;
                    psVar20 = psVar20 + 1;
                  } while (sVar5 != -1);
                  uVar21 = CONCAT71((int7)((ulong)psVar20 >> 8),0 < iVar37);
                  uVar28 = (ulong)(iVar37 + 1U);
                  uVar22 = local_1f0;
                } while (iVar37 + 1U != 2);
LAB_0018da54:
                uVar33 = local_1f8;
              } while ((uVar21 & 1) != 0);
              if (uVar10 != 0xffffffff) {
                local_238 = (ulong)(uVar10 << 3);
                local_228 = 8;
                local_218 = ~(byte)local_374 & 1;
                local_22c = local_374 >> 1 & 7;
                *local_220 = ((ulong)(byte)((byte)local_374 >> 4) & 3) * 0x101010101010101;
                *(char *)((long)&local_230 + local_390) = (char)(local_374 >> 8);
                *(undefined1 *)
                 ((long)&local_230 +
                 (ulong)(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                ::s_next_comp)[local_390]) = uVar7;
                *(undefined1 *)
                 ((long)&local_230 +
                 (ulong)(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                ::s_next_comp)[(int)local_390 + 1]) = uVar6;
              }
            }
          }
          local_1c8 = (undefined1)uVar14;
          local_1b0 = lVar24 != 0 && uVar14 == 0;
          if ((bool)local_1b0) {
            uStack_1b4 = local_280[0];
          }
          if (local_1e0.m_quality == cHighQuality) {
            local_1b8 = 9;
            local_1c0 = pack_etc1_block::s_scan_delta_0_to_4;
          }
          else if (local_1e0.m_quality == cMediumQuality) {
            local_1b8 = 3;
            local_1c0 = pack_etc1_block::s_scan_delta_0_to_1;
          }
          else {
            local_1b8 = 1;
            local_1c0 = pack_etc1_block::s_scan_delta_0;
          }
          puVar38 = &local_288 + lVar24 * 5;
          etc1_optimizer::init((etc1_optimizer *)local_1a8,(EVP_PKEY_CTX *)&local_1e0);
          bVar9 = etc1_optimizer::compute((etc1_optimizer *)local_1a8);
          if (!bVar9) break;
          if (0 < (int)local_1e0.m_quality) {
            uVar33 = *puVar38;
            if (3000 < uVar33) {
              local_1b8 = 2;
              if (6000 < uVar33) {
                local_1b8 = 8;
              }
              local_1c0 = pack_etc1_block::s_scan_delta_5_to_5;
              if (6000 < uVar33) {
                local_1c0 = pack_etc1_block::s_scan_delta_5_to_8;
              }
              if (local_1e0.m_quality == cMediumQuality) {
                local_1b8 = 4;
                local_1c0 = pack_etc1_block::s_scan_delta_2_to_3;
              }
              bVar9 = etc1_optimizer::compute((etc1_optimizer *)local_1a8);
              if (!bVar9) break;
            }
            uVar33 = local_238;
            if (local_238 < *puVar38) {
              local_280[lVar24 * 10] = local_230;
              local_268[lVar24 * 0x28] = local_218;
              local_280[lVar24 * 10 + 1] = local_22c;
              *puVar38 = uVar33;
              memcpy(*(void **)(local_268 + lVar24 * 0x28 + -8),local_220,(ulong)local_228);
            }
          }
          local_310 = local_310 + *puVar38;
          if (local_360 <= local_310) break;
          lVar24 = local_2e0[0] + 1;
          bVar39 = local_2e0[0] == 0;
        } while (bVar39);
        if (!bVar39) {
          local_378 = local_280[0];
          local_3a9 = local_268[0];
          local_380 = local_280[1];
          local_2f8 = local_288;
          memcpy(local_200,local_270,(ulong)local_280[2]);
          local_2f0 = (ulong)local_258;
          local_3aa = local_240;
          local_384 = local_254;
          local_300 = local_260;
          memcpy(local_208,local_248,(ulong)local_250);
          local_2e8 = (ulong)uVar14;
          local_360 = local_310;
          local_37c = iVar36;
        }
        bVar39 = uVar14 == 0;
        uVar14 = uVar14 + 1;
      } while (bVar39);
      bVar39 = iVar36 == 0;
      iVar36 = iVar36 + 1;
    } while (bVar39);
    local_2d0 = local_378;
    local_2b8 = local_3a9;
    local_2cc = local_380;
    local_2a8 = (uint)local_2f0;
    local_290[0] = local_3aa;
    local_2a4 = local_384;
    local_2b0 = local_300;
    local_2e0[1] = local_2f8;
    local_2a8._1_1_ = (byte)(local_2f0 >> 8);
    local_2d0._1_1_ = (byte)(local_378 >> 8);
    local_2a8._2_1_ = (byte)(local_2f0 >> 0x10);
    local_2d0._2_1_ = (byte)(local_378 >> 0x10);
    if ((int)local_2e8 == 0) {
      iVar36 = ((uint)local_2f0 & 0xff) - (local_378 & 0xff);
      *(byte *)pETC1_block =
           (byte)((local_378 & 0xff) << 3) | (char)iVar36 + (char)(iVar36 >> 0x1f) * -8;
      *(byte *)((long)pETC1_block + 1) =
           local_2d0._1_1_ << 3 |
           (char)((uint)local_2a8._1_1_ - (uint)local_2d0._1_1_) +
           (char)((int)((uint)local_2a8._1_1_ - (uint)local_2d0._1_1_) >> 0x1f) * -8;
      local_2a8._2_1_ =
           local_2d0._2_1_ << 3 |
           (char)((uint)local_2a8._2_1_ - (uint)local_2d0._2_1_) +
           (char)((int)((uint)local_2a8._2_1_ - (uint)local_2d0._2_1_) >> 0x1f) * -8;
    }
    else {
      *(byte *)pETC1_block = (char)local_378 << 4 | (byte)local_2f0;
      *(byte *)((long)pETC1_block + 1) = local_2d0._1_1_ << 4 | local_2a8._1_1_;
      local_2a8._2_1_ = local_2d0._2_1_ << 4 | local_2a8._2_1_;
    }
    uVar14 = (uint)local_360;
    *(byte *)((long)pETC1_block + 2) = local_2a8._2_1_;
    *(byte *)((long)pETC1_block + 3) =
         (((char)local_2e8 * '\x02' & 2U) + (char)local_384 * '\x04' | (byte)(local_380 << 5)) ^ 2 |
         (byte)local_37c;
    if (local_37c == 0) {
      uVar18 = 0;
      lVar24 = 1;
      uVar23 = 0;
      do {
        pbVar29 = (byte *)((long)(&local_2c0)[lVar24 * 5] + 7);
        iVar36 = 1;
        do {
          uVar10 = (uint)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)*pbVar29) * 2;
          uVar23 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar29[-3]) & 1 |
                   (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar29[-1]) & 1 |
                   (uVar10 & 2) + uVar23 * 4) * 4 +
                   (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar29[-2]) & 1) * 2;
          uVar13 = (undefined2)uVar23;
          uVar18 = (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar29[-3]) >> 1) |
                   *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar29[-2]) & 0xfffffffe |
                   (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar29[-1]) & 0xfffffffe |
                    uVar18 << 3 | uVar10 & 0xfffffffc) * 2;
          uVar17 = (undefined2)uVar18;
          pbVar29 = pbVar29 + -4;
          iVar36 = iVar36 + -1;
        } while (iVar36 == 0);
        bVar39 = lVar24 != 0;
        lVar24 = lVar24 + -1;
      } while (bVar39);
    }
    else {
      uVar18 = 0;
      lVar24 = 7;
      uVar23 = 0;
      do {
        bVar12 = *(byte *)((long)&g_selector_index_to_etc1 +
                          (ulong)*(byte *)((long)local_298 + lVar24 + -4));
        uVar10 = (uint)*(byte *)((long)&g_selector_index_to_etc1 +
                                (ulong)*(byte *)((long)local_298 + lVar24)) * 2;
        bVar25 = *(byte *)((long)&g_selector_index_to_etc1 +
                          (ulong)*(byte *)((long)local_2c0 + lVar24));
        bVar1 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)((long)local_2c0 + lVar24 + -4));
        uVar23 = bVar1 & 1 | (bVar12 & 1 | (uVar10 & 2) + uVar23 * 4) * 4 + (bVar25 & 1) * 2;
        uVar13 = (undefined2)uVar23;
        uVar18 = (uint)(bVar1 >> 1) | bVar25 & 0xfffffffe |
                 (bVar12 & 0xfffffffe | uVar18 << 3 | uVar10 & 0xfffffffc) * 2;
        uVar17 = (undefined2)uVar18;
        lVar24 = lVar24 + -1;
      } while (lVar24 != 3);
    }
    *(char *)((long)pETC1_block + 4) = (char)((ushort)uVar17 >> 8);
    *(char *)((long)pETC1_block + 5) = (char)uVar17;
    *(char *)((long)pETC1_block + 6) = (char)((ushort)uVar13 >> 8);
    *(char *)((long)pETC1_block + 7) = (char)uVar13;
  }
  return uVar14;
}

Assistant:

unsigned int pack_etc1_block(void* pETC1_block, const unsigned int* pSrc_pixels_rgba, etc1_pack_params& pack_params) {
  const color_quad_u8* pSrc_pixels = reinterpret_cast<const color_quad_u8*>(pSrc_pixels_rgba);
  etc1_block& dst_block = *static_cast<etc1_block*>(pETC1_block);

  color_quad_u8 src_pixel0(pSrc_pixels[0]);

  // Check for solid block.
  const uint32 first_pixel_u32 = pSrc_pixels->m_u32;
  int r;
  for (r = 15; r >= 1; --r)
    if (pSrc_pixels[r].m_u32 != first_pixel_u32)
      break;
  if (!r)
    return static_cast<unsigned int>(16 * pack_etc1_block_solid_color(dst_block, &pSrc_pixels[0].r));

  color_quad_u8 dithered_pixels[16];
  if (pack_params.m_dithering) {
    dither_block_555(dithered_pixels, pSrc_pixels);
    pSrc_pixels = dithered_pixels;
  }

  etc1_optimizer optimizer;

  uint64 best_error = cUINT64_MAX;
  uint best_flip = false, best_use_color4 = false;

  uint8 best_selectors[2][8];
  etc1_optimizer::results best_results[2];
  for (uint i = 0; i < 2; i++) {
    best_results[i].m_n = 8;
    best_results[i].m_pSelectors = best_selectors[i];
  }

  uint8 selectors[3][8];
  etc1_optimizer::results results[3];

  for (uint i = 0; i < 3; i++) {
    results[i].m_n = 8;
    results[i].m_pSelectors = selectors[i];
  }

  color_quad_u8 subblock_pixels[8];

  etc1_optimizer::params params(pack_params);
  params.m_num_src_pixels = 8;
  params.m_pSrc_pixels = subblock_pixels;

  for (uint flip = 0; flip < 2; flip++) {
    for (uint use_color4 = 0; use_color4 < 2; use_color4++) {
      uint64 trial_error = 0;

      uint subblock;
      for (subblock = 0; subblock < 2; subblock++) {
        if (flip)
          memcpy(subblock_pixels, pSrc_pixels + subblock * 8, sizeof(color_quad_u8) * 8);
        else {
          const color_quad_u8* pSrc_col = pSrc_pixels + subblock * 2;
          subblock_pixels[0] = pSrc_col[0];
          subblock_pixels[1] = pSrc_col[4];
          subblock_pixels[2] = pSrc_col[8];
          subblock_pixels[3] = pSrc_col[12];
          subblock_pixels[4] = pSrc_col[1];
          subblock_pixels[5] = pSrc_col[5];
          subblock_pixels[6] = pSrc_col[9];
          subblock_pixels[7] = pSrc_col[13];
        }

        results[2].m_error = cUINT64_MAX;
        if ((params.m_quality >= cMediumQuality) && ((subblock) || (use_color4))) {
          const uint32 subblock_pixel0_u32 = subblock_pixels[0].m_u32;
          for (r = 7; r >= 1; --r)
            if (subblock_pixels[r].m_u32 != subblock_pixel0_u32)
              break;
          if (!r) {
            pack_etc1_block_solid_color_constrained(results[2], 8, &subblock_pixels[0].r, !use_color4, (subblock && !use_color4) ? &results[0].m_block_color_unscaled : NULL);
          }
        }

        params.m_use_color4 = (use_color4 != 0);
        params.m_constrain_against_base_color5 = false;

        if ((!use_color4) && (subblock)) {
          params.m_constrain_against_base_color5 = true;
          params.m_base_color5 = results[0].m_block_color_unscaled;
        }

        if (params.m_quality == cHighQuality) {
          static const int s_scan_delta_0_to_4[] = {-4, -3, -2, -1, 0, 1, 2, 3, 4};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_4);
          params.m_pScan_deltas = s_scan_delta_0_to_4;
        } else if (params.m_quality == cMediumQuality) {
          static const int s_scan_delta_0_to_1[] = {-1, 0, 1};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_1);
          params.m_pScan_deltas = s_scan_delta_0_to_1;
        } else {
          static const int s_scan_delta_0[] = {0};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0);
          params.m_pScan_deltas = s_scan_delta_0;
        }

        optimizer.init(params, results[subblock]);
        if (!optimizer.compute())
          break;

        if (params.m_quality >= cMediumQuality) {
          // TODO: Fix fairly arbitrary/unrefined thresholds that control how far away to scan for potentially better solutions.
          const uint refinement_error_thresh0 = 3000;
          const uint refinement_error_thresh1 = 6000;
          if (results[subblock].m_error > refinement_error_thresh0) {
            if (params.m_quality == cMediumQuality) {
              static const int s_scan_delta_2_to_3[] = {-3, -2, 2, 3};
              params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_2_to_3);
              params.m_pScan_deltas = s_scan_delta_2_to_3;
            } else {
              static const int s_scan_delta_5_to_5[] = {-5, 5};
              static const int s_scan_delta_5_to_8[] = {-8, -7, -6, -5, 5, 6, 7, 8};
              if (results[subblock].m_error > refinement_error_thresh1) {
                params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_8);
                params.m_pScan_deltas = s_scan_delta_5_to_8;
              } else {
                params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_5);
                params.m_pScan_deltas = s_scan_delta_5_to_5;
              }
            }

            if (!optimizer.compute())
              break;
          }

          if (results[2].m_error < results[subblock].m_error)
            results[subblock] = results[2];
        }

        trial_error += results[subblock].m_error;
        if (trial_error >= best_error)
          break;
      }

      if (subblock < 2)
        continue;

      best_error = trial_error;
      best_results[0] = results[0];
      best_results[1] = results[1];
      best_flip = flip;
      best_use_color4 = use_color4;

    }  // use_color4

  }  // flip

  int dr = best_results[1].m_block_color_unscaled.r - best_results[0].m_block_color_unscaled.r;
  int dg = best_results[1].m_block_color_unscaled.g - best_results[0].m_block_color_unscaled.g;
  int db = best_results[1].m_block_color_unscaled.b - best_results[0].m_block_color_unscaled.b;
  RG_ETC1_ASSERT(best_use_color4 || (rg_etc1::minimum(dr, dg, db) >= cETC1ColorDeltaMin) && (rg_etc1::maximum(dr, dg, db) <= cETC1ColorDeltaMax));

  if (best_use_color4) {
    dst_block.m_bytes[0] = static_cast<uint8>(best_results[1].m_block_color_unscaled.r | (best_results[0].m_block_color_unscaled.r << 4));
    dst_block.m_bytes[1] = static_cast<uint8>(best_results[1].m_block_color_unscaled.g | (best_results[0].m_block_color_unscaled.g << 4));
    dst_block.m_bytes[2] = static_cast<uint8>(best_results[1].m_block_color_unscaled.b | (best_results[0].m_block_color_unscaled.b << 4));
  } else {
    if (dr < 0)
      dr += 8;
    dst_block.m_bytes[0] = static_cast<uint8>((best_results[0].m_block_color_unscaled.r << 3) | dr);
    if (dg < 0)
      dg += 8;
    dst_block.m_bytes[1] = static_cast<uint8>((best_results[0].m_block_color_unscaled.g << 3) | dg);
    if (db < 0)
      db += 8;
    dst_block.m_bytes[2] = static_cast<uint8>((best_results[0].m_block_color_unscaled.b << 3) | db);
  }

  dst_block.m_bytes[3] = static_cast<uint8>((best_results[1].m_block_inten_table << 2) | (best_results[0].m_block_inten_table << 5) | ((~best_use_color4 & 1) << 1) | best_flip);

  uint selector0 = 0, selector1 = 0;
  if (best_flip) {
    // flipped:
    // { 0, 0 }, { 1, 0 }, { 2, 0 }, { 3, 0 },
    // { 0, 1 }, { 1, 1 }, { 2, 1 }, { 3, 1 }
    //
    // { 0, 2 }, { 1, 2 }, { 2, 2 }, { 3, 2 },
    // { 0, 3 }, { 1, 3 }, { 2, 3 }, { 3, 3 }
    const uint8* pSelectors0 = best_results[0].m_pSelectors;
    const uint8* pSelectors1 = best_results[1].m_pSelectors;
    for (int x = 3; x >= 0; --x) {
      uint b;
      b = g_selector_index_to_etc1[pSelectors1[4 + x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors1[x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors0[4 + x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors0[x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);
    }
  } else {
    // non-flipped:
    // { 0, 0 }, { 0, 1 }, { 0, 2 }, { 0, 3 },
    // { 1, 0 }, { 1, 1 }, { 1, 2 }, { 1, 3 }
    //
    // { 2, 0 }, { 2, 1 }, { 2, 2 }, { 2, 3 },
    // { 3, 0 }, { 3, 1 }, { 3, 2 }, { 3, 3 }
    for (int subblock = 1; subblock >= 0; --subblock) {
      const uint8* pSelectors = best_results[subblock].m_pSelectors + 4;
      for (uint i = 0; i < 2; i++) {
        uint b;
        b = g_selector_index_to_etc1[pSelectors[3]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[2]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[1]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[0]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        pSelectors -= 4;
      }
    }
  }

  dst_block.m_bytes[4] = static_cast<uint8>(selector1 >> 8);
  dst_block.m_bytes[5] = static_cast<uint8>(selector1 & 0xFF);
  dst_block.m_bytes[6] = static_cast<uint8>(selector0 >> 8);
  dst_block.m_bytes[7] = static_cast<uint8>(selector0 & 0xFF);

  return static_cast<unsigned int>(best_error);
}